

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

int __thiscall Map_Chest::DelItem(Map_Chest *this,short item_id)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  pointer pMVar4;
  double dVar5;
  const_iterator local_68;
  reference local_60;
  Map_Chest_Spawn *spawn;
  iterator __end4;
  iterator __begin4;
  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *__range4;
  double current_time;
  iterator iStack_30;
  int amount;
  _Self local_28;
  iterator it;
  short item_id_local;
  Map_Chest *this_local;
  
  it._M_node._6_2_ = item_id;
  local_28._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<Map_Chest_Item,std::allocator<Map_Chest_Item>>>(&this->items);
  while( true ) {
    iStack_30 = std::end<std::__cxx11::list<Map_Chest_Item,std::allocator<Map_Chest_Item>>>
                          (&this->items);
    bVar3 = std::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar3) {
      return 0;
    }
    pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
    if (pMVar4->id == it._M_node._6_2_) break;
    std::_List_iterator<Map_Chest_Item>::operator++(&local_28);
  }
  pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
  iVar1 = pMVar4->amount;
  pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
  if (pMVar4->slot != 0) {
    dVar5 = Timer::GetTime();
    __end4 = std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::begin
                       (&this->spawns);
    spawn = (Map_Chest_Spawn *)
            std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::end
                      (&this->spawns);
    while (bVar3 = std::operator!=(&__end4,(_Self *)&spawn), bVar3) {
      local_60 = std::_List_iterator<Map_Chest_Spawn>::operator*(&__end4);
      iVar2 = local_60->slot;
      pMVar4 = std::_List_iterator<Map_Chest_Item>::operator->(&local_28);
      if (iVar2 == pMVar4->slot) {
        local_60->last_taken = dVar5;
      }
      std::_List_iterator<Map_Chest_Spawn>::operator++(&__end4);
    }
  }
  std::_List_const_iterator<Map_Chest_Item>::_List_const_iterator(&local_68,&local_28);
  std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::erase(&this->items,local_68);
  return iVar1;
}

Assistant:

int Map_Chest::DelItem(short item_id)
{
	UTIL_IFOREACH(this->items, it)
	{
		if (it->id == item_id)
		{
			int amount = it->amount;

			if (it->slot)
			{
				double current_time = Timer::GetTime();

				UTIL_FOREACH_REF(this->spawns, spawn)
				{
					if (spawn.slot == it->slot)
					{
						spawn.last_taken = current_time;
					}
				}
			}

			this->items.erase(it);
			return amount;
		}
	}

	return 0;
}